

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_printf.h
# Opt level: O0

void stbsp__raise_to_power10(double *ohi,double *olo,double d,int power)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double s_3;
  int cn_23;
  int cn_22;
  int cn_21;
  int cn_20;
  longlong bt_5;
  double blo_5;
  double bhi_5;
  double alo_5;
  double ahi_5;
  double s_2;
  int cn_19;
  int cn_18;
  int cn_17;
  int cn_16;
  longlong bt_4;
  double blo_4;
  double bhi_4;
  double alo_4;
  double ahi_4;
  double s_1;
  int cn_15;
  int cn_14;
  int cn_13;
  int cn_12;
  longlong bt_3;
  double blo_3;
  double bhi_3;
  double alo_3;
  double ahi_3;
  int cn_11;
  int cn_10;
  int cn_9;
  int cn_8;
  longlong bt_2;
  double blo_2;
  double bhi_2;
  double alo_2;
  double ahi_2;
  double s;
  int cn_7;
  int cn_6;
  int cn_5;
  int cn_4;
  longlong bt_1;
  double blo_1;
  double bhi_1;
  double alo_1;
  double ahi_1;
  double p2l;
  double p2h;
  int local_78;
  int eb;
  int et;
  int e;
  int cn_3;
  int cn_2;
  int cn_1;
  int cn;
  longlong bt;
  double blo;
  double bhi;
  double alo;
  double ahi;
  double pl;
  double ph;
  double dStack_20;
  int power_local;
  double d_local;
  double *olo_local;
  double *ohi_local;
  
  dStack_20 = d;
  if ((power < 0) || (0x16 < power)) {
    eb = power;
    if (power < 0) {
      eb = -power;
    }
    local_78 = eb * 0x2c9 >> 0xe;
    if (0xd < local_78) {
      local_78 = 0xd;
    }
    iVar1 = eb + local_78 * -0x17;
    ahi = 0.0;
    pl = d;
    if (power < 0) {
      if (iVar1 != 0) {
        iVar1 = iVar1 + -1;
        alo_1 = 0.0;
        blo_1 = 0.0;
        dVar2 = stbsp__negbot[iVar1];
        pl = d * dVar2;
        for (cn_6 = 0; cn_6 < 8; cn_6 = cn_6 + 1) {
          *(undefined1 *)((long)&cn_5 + (long)cn_6) =
               *(undefined1 *)((long)&stack0xffffffffffffffe0 + (long)cn_6);
        }
        _cn_5 = _cn_5 & 0xfffffffff8000000;
        for (cn_7 = 0; cn_7 < 8; cn_7 = cn_7 + 1) {
          *(undefined1 *)((long)&alo_1 + (long)cn_7) = *(undefined1 *)((long)&cn_5 + (long)cn_7);
        }
        for (s._4_4_ = 0; s._4_4_ < 8; s._4_4_ = s._4_4_ + 1) {
          *(undefined1 *)((long)&cn_5 + (long)s._4_4_) =
               *(undefined1 *)((long)stbsp__negbot + (long)s._4_4_ + (long)iVar1 * 8);
        }
        _cn_5 = _cn_5 & 0xfffffffff8000000;
        for (s._0_4_ = 0; s._0_4_ < 8; s._0_4_ = s._0_4_ + 1) {
          *(undefined1 *)((long)&blo_1 + (long)s._0_4_) =
               *(undefined1 *)((long)&cn_5 + (long)s._0_4_);
        }
        ahi = d * stbsp__negboterr[iVar1] +
              (d - alo_1) * (stbsp__negbot[iVar1] - blo_1) +
              (d - alo_1) * blo_1 +
              alo_1 * (stbsp__negbot[iVar1] - blo_1) + alo_1 * blo_1 + -(d * dVar2);
      }
      if (local_78 != 0) {
        dVar2 = pl + ahi;
        dVar3 = dVar2 - pl;
        pl = dVar2;
        local_78 = local_78 + -1;
        alo_2 = 0.0;
        blo_2 = 0.0;
        pl = dVar2 * stbsp__negtop[local_78];
        for (cn_10 = 0; cn_10 < 8; cn_10 = cn_10 + 1) {
          *(undefined1 *)((long)&cn_9 + (long)cn_10) = *(undefined1 *)((long)&pl + (long)cn_10);
        }
        _cn_9 = _cn_9 & 0xfffffffff8000000;
        for (cn_11 = 0; cn_11 < 8; cn_11 = cn_11 + 1) {
          *(undefined1 *)((long)&alo_2 + (long)cn_11) = *(undefined1 *)((long)&cn_9 + (long)cn_11);
        }
        for (ahi_3._4_4_ = 0; ahi_3._4_4_ < 8; ahi_3._4_4_ = ahi_3._4_4_ + 1) {
          *(undefined1 *)((long)&cn_9 + (long)ahi_3._4_4_) =
               *(undefined1 *)((long)stbsp__negtop + (long)ahi_3._4_4_ + (long)local_78 * 8);
        }
        _cn_9 = _cn_9 & 0xfffffffff8000000;
        for (ahi_3._0_4_ = 0; ahi_3._0_4_ < 8; ahi_3._0_4_ = ahi_3._0_4_ + 1) {
          *(undefined1 *)((long)&blo_2 + (long)ahi_3._0_4_) =
               *(undefined1 *)((long)&cn_9 + (long)ahi_3._0_4_);
        }
        ahi = (dVar2 - alo_2) * (stbsp__negtop[local_78] - blo_2) +
              (dVar2 - alo_2) * blo_2 +
              alo_2 * (stbsp__negtop[local_78] - blo_2) + alo_2 * blo_2 + -pl +
              dVar2 * stbsp__negtoperr[local_78] + (ahi - dVar3) * stbsp__negtop[local_78];
      }
    }
    else {
      if (iVar1 != 0) {
        p2h._4_4_ = iVar1;
        if (0x16 < iVar1) {
          p2h._4_4_ = 0x16;
        }
        iVar1 = iVar1 - p2h._4_4_;
        alo_3 = 0.0;
        blo_3 = 0.0;
        dVar2 = d * stbsp__bot[p2h._4_4_];
        pl = dVar2;
        for (cn_14 = 0; cn_14 < 8; cn_14 = cn_14 + 1) {
          *(undefined1 *)((long)&cn_13 + (long)cn_14) =
               *(undefined1 *)((long)&stack0xffffffffffffffe0 + (long)cn_14);
        }
        _cn_13 = _cn_13 & 0xfffffffff8000000;
        for (cn_15 = 0; cn_15 < 8; cn_15 = cn_15 + 1) {
          *(undefined1 *)((long)&alo_3 + (long)cn_15) = *(undefined1 *)((long)&cn_13 + (long)cn_15);
        }
        for (s_1._4_4_ = 0; s_1._4_4_ < 8; s_1._4_4_ = s_1._4_4_ + 1) {
          *(undefined1 *)((long)&cn_13 + (long)s_1._4_4_) =
               *(undefined1 *)((long)stbsp__bot + (long)s_1._4_4_ + (long)p2h._4_4_ * 8);
        }
        _cn_13 = _cn_13 & 0xfffffffff8000000;
        for (s_1._0_4_ = 0; s_1._0_4_ < 8; s_1._0_4_ = s_1._0_4_ + 1) {
          *(undefined1 *)((long)&blo_3 + (long)s_1._0_4_) =
               *(undefined1 *)((long)&cn_13 + (long)s_1._0_4_);
        }
        ahi = (d - alo_3) * (stbsp__bot[p2h._4_4_] - blo_3) +
              (d - alo_3) * blo_3 + alo_3 * (stbsp__bot[p2h._4_4_] - blo_3) + alo_3 * blo_3 + -dVar2
        ;
        if (iVar1 != 0) {
          dVar3 = dVar2 + ahi;
          pl = dVar3;
          alo_4 = 0.0;
          blo_4 = 0.0;
          pl = dVar3 * stbsp__bot[iVar1];
          for (cn_18 = 0; cn_18 < 8; cn_18 = cn_18 + 1) {
            *(undefined1 *)((long)&cn_17 + (long)cn_18) = *(undefined1 *)((long)&pl + (long)cn_18);
          }
          _cn_17 = _cn_17 & 0xfffffffff8000000;
          for (cn_19 = 0; cn_19 < 8; cn_19 = cn_19 + 1) {
            *(undefined1 *)((long)&alo_4 + (long)cn_19) =
                 *(undefined1 *)((long)&cn_17 + (long)cn_19);
          }
          for (s_2._4_4_ = 0; s_2._4_4_ < 8; s_2._4_4_ = s_2._4_4_ + 1) {
            *(undefined1 *)((long)&cn_17 + (long)s_2._4_4_) =
                 *(undefined1 *)((long)stbsp__bot + (long)s_2._4_4_ + (long)iVar1 * 8);
          }
          _cn_17 = _cn_17 & 0xfffffffff8000000;
          for (s_2._0_4_ = 0; s_2._0_4_ < 8; s_2._0_4_ = s_2._0_4_ + 1) {
            *(undefined1 *)((long)&blo_4 + (long)s_2._0_4_) =
                 *(undefined1 *)((long)&cn_17 + (long)s_2._0_4_);
          }
          ahi = stbsp__bot[iVar1] * (ahi - (dVar3 - dVar2)) +
                (dVar3 - alo_4) * (stbsp__bot[iVar1] - blo_4) +
                (dVar3 - alo_4) * blo_4 + alo_4 * (stbsp__bot[iVar1] - blo_4) + alo_4 * blo_4 + -pl;
        }
      }
      if (local_78 != 0) {
        dVar2 = pl + ahi;
        dVar3 = dVar2 - pl;
        pl = dVar2;
        local_78 = local_78 + -1;
        alo_5 = 0.0;
        blo_5 = 0.0;
        pl = dVar2 * stbsp__top[local_78];
        for (cn_22 = 0; cn_22 < 8; cn_22 = cn_22 + 1) {
          *(undefined1 *)((long)&cn_21 + (long)cn_22) = *(undefined1 *)((long)&pl + (long)cn_22);
        }
        _cn_21 = _cn_21 & 0xfffffffff8000000;
        for (cn_23 = 0; cn_23 < 8; cn_23 = cn_23 + 1) {
          *(undefined1 *)((long)&alo_5 + (long)cn_23) = *(undefined1 *)((long)&cn_21 + (long)cn_23);
        }
        for (s_3._4_4_ = 0; s_3._4_4_ < 8; s_3._4_4_ = s_3._4_4_ + 1) {
          *(undefined1 *)((long)&cn_21 + (long)s_3._4_4_) =
               *(undefined1 *)((long)stbsp__top + (long)s_3._4_4_ + (long)local_78 * 8);
        }
        _cn_21 = _cn_21 & 0xfffffffff8000000;
        for (s_3._0_4_ = 0; s_3._0_4_ < 8; s_3._0_4_ = s_3._0_4_ + 1) {
          *(undefined1 *)((long)&blo_5 + (long)s_3._0_4_) =
               *(undefined1 *)((long)&cn_21 + (long)s_3._0_4_);
        }
        ahi = (dVar2 - alo_5) * (stbsp__top[local_78] - blo_5) +
              (dVar2 - alo_5) * blo_5 + alo_5 * (stbsp__top[local_78] - blo_5) + alo_5 * blo_5 + -pl
              + dVar2 * stbsp__toperr[local_78] + (ahi - dVar3) * stbsp__top[local_78];
      }
    }
  }
  else {
    alo = 0.0;
    blo = 0.0;
    dVar2 = stbsp__bot[power];
    pl = d * dVar2;
    for (cn_2 = 0; cn_2 < 8; cn_2 = cn_2 + 1) {
      *(undefined1 *)((long)&cn_1 + (long)cn_2) =
           *(undefined1 *)((long)&stack0xffffffffffffffe0 + (long)cn_2);
    }
    _cn_1 = _cn_1 & 0xfffffffff8000000;
    for (cn_3 = 0; cn_3 < 8; cn_3 = cn_3 + 1) {
      *(undefined1 *)((long)&alo + (long)cn_3) = *(undefined1 *)((long)&cn_1 + (long)cn_3);
    }
    for (e = 0; e < 8; e = e + 1) {
      *(undefined1 *)((long)&cn_1 + (long)e) =
           *(undefined1 *)((long)stbsp__bot + (long)e + (long)power * 8);
    }
    _cn_1 = _cn_1 & 0xfffffffff8000000;
    for (et = 0; et < 8; et = et + 1) {
      *(undefined1 *)((long)&blo + (long)et) = *(undefined1 *)((long)&cn_1 + (long)et);
    }
    ahi = (d - alo) * (stbsp__bot[power] - blo) +
          (d - alo) * blo + alo * (stbsp__bot[power] - blo) + alo * blo + -(d * dVar2);
  }
  *ohi = pl + ahi;
  *olo = ahi - ((pl + ahi) - pl);
  return;
}

Assistant:

static void stbsp__raise_to_power10(double *ohi, double *olo, double d, stbsp__int32 power) // power can be -323 to +350
{
   double ph, pl;
   if ((power >= 0) && (power <= 22)) {
      stbsp__ddmulthi(ph, pl, d, stbsp__bot[power]);
   } else {
      stbsp__int32 e, et, eb;
      double p2h, p2l;

      e = power;
      if (power < 0)
         e = -e;
      et = (e * 0x2c9) >> 14; /* %23 */
      if (et > 13)
         et = 13;
      eb = e - (et * 23);

      ph = d;
      pl = 0.0;
      if (power < 0) {
         if (eb) {
            --eb;
            stbsp__ddmulthi(ph, pl, d, stbsp__negbot[eb]);
            stbsp__ddmultlos(ph, pl, d, stbsp__negboterr[eb]);
         }
         if (et) {
            stbsp__ddrenorm(ph, pl);
            --et;
            stbsp__ddmulthi(p2h, p2l, ph, stbsp__negtop[et]);
            stbsp__ddmultlo(p2h, p2l, ph, pl, stbsp__negtop[et], stbsp__negtoperr[et]);
            ph = p2h;
            pl = p2l;
         }
      } else {
         if (eb) {
            e = eb;
            if (eb > 22)
               eb = 22;
            e -= eb;
            stbsp__ddmulthi(ph, pl, d, stbsp__bot[eb]);
            if (e) {
               stbsp__ddrenorm(ph, pl);
               stbsp__ddmulthi(p2h, p2l, ph, stbsp__bot[e]);
               stbsp__ddmultlos(p2h, p2l, stbsp__bot[e], pl);
               ph = p2h;
               pl = p2l;
            }
         }
         if (et) {
            stbsp__ddrenorm(ph, pl);
            --et;
            stbsp__ddmulthi(p2h, p2l, ph, stbsp__top[et]);
            stbsp__ddmultlo(p2h, p2l, ph, pl, stbsp__top[et], stbsp__toperr[et]);
            ph = p2h;
            pl = p2l;
         }
      }
   }
   stbsp__ddrenorm(ph, pl);
   *ohi = ph;
   *olo = pl;
}